

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  uint8 *puVar2;
  int byte_size_before_serialization;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  
  byte_size_before_serialization = (*this->_vptr_MessageLite[9])();
  iVar3 = output->buffer_size_;
  if (byte_size_before_serialization <= iVar3) {
    puVar2 = output->buffer_;
    output->buffer_ = puVar2 + byte_size_before_serialization;
    output->buffer_size_ = iVar3 - byte_size_before_serialization;
    iVar3 = iVar3 - byte_size_before_serialization;
    if (puVar2 != (uint8 *)0x0) {
      iVar3 = (*this->_vptr_MessageLite[0xb])(this,puVar2);
      lVar5 = CONCAT44(extraout_var,iVar3) - (long)puVar2;
      if (lVar5 == byte_size_before_serialization) {
        return true;
      }
      iVar3 = (*this->_vptr_MessageLite[9])(this);
      anon_unknown_9::ByteSizeConsistencyError(byte_size_before_serialization,iVar3,(int)lVar5);
      return true;
    }
  }
  iVar4 = output->total_bytes_;
  (*this->_vptr_MessageLite[10])(this,output);
  bVar1 = output->had_error_;
  if ((bVar1 == false) &&
     (iVar3 = (output->total_bytes_ - output->buffer_size_) + (iVar3 - iVar4),
     iVar3 != byte_size_before_serialization)) {
    iVar4 = (*this->_vptr_MessageLite[9])(this);
    anon_unknown_9::ByteSizeConsistencyError(byte_size_before_serialization,iVar4,iVar3);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const int size = ByteSize();  // Force size to be cached.
  uint8* buffer = output->GetDirectBufferForNBytesAndAdvance(size);
  if (buffer != NULL) {
    uint8* end = SerializeWithCachedSizesToArray(buffer);
    if (end - buffer != size) {
      ByteSizeConsistencyError(size, ByteSize(), end - buffer);
    }
    return true;
  } else {
    int original_byte_count = output->ByteCount();
    SerializeWithCachedSizes(output);
    if (output->HadError()) {
      return false;
    }
    int final_byte_count = output->ByteCount();

    if (final_byte_count - original_byte_count != size) {
      ByteSizeConsistencyError(size, ByteSize(),
                               final_byte_count - original_byte_count);
    }

    return true;
  }
}